

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryBuilder::visitGlobalGet(WasmBinaryBuilder *this,GlobalGet *curr)

{
  pointer puVar1;
  __uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true> _Var2;
  char *pcVar3;
  bool bVar4;
  ostream *poVar5;
  vector<wasm::Name*,std::allocator<wasm::Name*>> *this_00;
  string local_50;
  Name *local_30;
  uint32_t local_24 [2];
  uint32_t index;
  
  bVar4 = isDebugEnabled("binary");
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"zz node: GlobalGet ",0x13);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  local_24[0] = getU32LEB(this);
  puVar1 = (this->wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)local_24[0] <
      (ulong)((long)(this->wasm->globals).
                    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    _Var2.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
         puVar1[local_24[0]]._M_t.
         super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>;
    pcVar3 = *(char **)((long)_Var2.
                              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                              .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 8);
    (curr->name).super_IString.str._M_len =
         *(size_t *)
          _Var2.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    (curr->name).super_IString.str._M_str = pcVar3;
    (curr->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id =
         *(size_t *)
          ((long)_Var2.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38);
    this_00 = (vector<wasm::Name*,std::allocator<wasm::Name*>> *)
              std::
              map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
              ::operator[](&this->globalRefs,local_24);
    local_30 = &curr->name;
    std::vector<wasm::Name*,std::allocator<wasm::Name*>>::emplace_back<wasm::Name*>
              (this_00,&local_30);
    return;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"invalid global index","");
  throwError(this,&local_50);
}

Assistant:

void WasmBinaryBuilder::visitGlobalGet(GlobalGet* curr) {
  BYN_TRACE("zz node: GlobalGet " << pos << std::endl);
  auto index = getU32LEB();
  if (index >= wasm.globals.size()) {
    throwError("invalid global index");
  }
  auto* global = wasm.globals[index].get();
  curr->name = global->name;
  curr->type = global->type;
  globalRefs[index].push_back(&curr->name); // we don't know the final name yet
}